

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip6.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnIPv6::Append(ColumnIPv6 *this,ColumnRef *column)

{
  element_type *peVar1;
  shared_ptr<clickhouse::ColumnIPv6> col;
  __shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  _func_int **local_20;
  
  Column::As<clickhouse::ColumnIPv6>((Column *)&stack0xffffffffffffffe0);
  if (local_20 != (_func_int **)0x0) {
    peVar1 = (this->data_).
             super___shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<clickhouse::ColumnFixedString,void>
              (local_30,(__shared_ptr<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2> *)
                        (local_20 + 5));
    (*(peVar1->super_Column)._vptr_Column[2])(peVar1,local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void ColumnIPv6::Append(ColumnRef column) {
    if (auto col = column->As<ColumnIPv6>()) {
        data_->Append(col->data_);
    }
}